

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<1024U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::uintwide_t<1024U,_unsigned_int,_void,_false>::operator*=
          (uintwide_t<1024U,_unsigned_int,_void,_false> *this,
          uintwide_t<1024U,_unsigned_int,_void,_false> *other)

{
  long lVar1;
  value_type_conflict *pvVar2;
  uintwide_t<1024U,_unsigned_int,_void,_false> *puVar3;
  uintwide_t<1024U,_unsigned_int,_void,_false> other_as_self_copy;
  
  if (this == other) {
    pvVar2 = (value_type_conflict *)other;
    puVar3 = &other_as_self_copy;
    for (lVar1 = 0x20; other = &other_as_self_copy, lVar1 != 0; lVar1 = lVar1 + -1) {
      *(value_type_conflict *)puVar3 = *pvVar2;
      pvVar2 = pvVar2 + 1;
      puVar3 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)((long)puVar3 + 4);
    }
  }
  void_math::wide_integer::uintwide_t<1024u,unsigned_int,void,false>::eval_mul_unary<1024u>(math::
  wide_integer::uintwide_t<1024u,unsigned_int,void,false>&,math::wide_integer::
  uintwide_t<1024u,unsigned_int,void,false>const&,std::enable_if<((1024u)/std::
  numeric_limits<unsigned_int>::digits)<math::wide_integer::
  uintwide_t<1024u,unsigned_int,void,false>::number_of_limbs_karatsuba_threshold,void>::type__
            (this,other,
             (enable_if_t<((1024U___std::numeric_limits<unsigned_int>::digits)_<_number_of_limbs_karatsuba_threshold)>
              *)0x0);
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }